

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O1

void __thiscall
TPZMeshSolution::TPZMeshSolution(TPZMeshSolution *this,TPZCompMesh *cmesh,int materialid)

{
  long lVar1;
  int iVar2;
  TPZMaterial *pTVar3;
  TPZGeoEl **ppTVar4;
  long nelem;
  long lVar5;
  long *local_50 [2];
  long local_40 [2];
  
  this->super_TPZFunction<double> = (TPZFunction<double>)&PTR__TPZMeshSolution_01994c00;
  this->fMesh = cmesh;
  TPZManVector<double,_3>::TPZManVector(&this->fLastLoc,0);
  this->fMaterialIndex = materialid;
  iVar2 = cmesh->fDimModel;
  this->fDimension = iVar2;
  local_50[0] = (long *)0x0;
  TPZManVector<double,_3>::Resize(&this->fLastLoc,(long)iVar2,(double *)local_50);
  pTVar3 = TPZCompMesh::FindMaterial(cmesh,materialid);
  if (pTVar3 == (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZMeshSolution.cpp"
               ,0x26);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Pressure","");
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x80))(pTVar3,local_50);
  this->fSolutionVarindex = iVar2;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Derivative","");
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x80))(pTVar3,local_50);
  this->fGradVarindex = iVar2;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x88))(pTVar3,this->fSolutionVarindex);
  this->fNumSolutions = iVar2;
  lVar1 = (cmesh->fReference->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  nelem = 0;
  lVar5 = nelem;
  if (0 < lVar1) {
    do {
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(this->fMesh->fReference->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
      if ((*ppTVar4 != (TPZGeoEl *)0x0) &&
         (iVar2 = (**(code **)(*(long *)*ppTVar4 + 0x210))(), lVar5 = nelem,
         iVar2 == this->fDimension)) break;
      nelem = nelem + 1;
      lVar5 = lVar1;
    } while (lVar1 != nelem);
  }
  if (lVar5 != lVar1) {
    this->fGeoElIndex = lVar5;
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZMeshSolution.cpp"
             ,0x34);
}

Assistant:

TPZMeshSolution::TPZMeshSolution(TPZCompMesh *cmesh, int materialid) : 
TPZRegisterClassId(&TPZMeshSolution::ClassId),
fMesh(cmesh), fMaterialIndex(materialid)
{
    fDimension = cmesh->Dimension();
    fLastLoc.Resize(fDimension,0.);
    TPZMaterial *material = cmesh->FindMaterial(materialid);
    if (!material) {
        DebugStop();
    }
    fSolutionVarindex = material->VariableIndex("Pressure");
    fGradVarindex = material->VariableIndex("Derivative");
    fNumSolutions = material->NSolutionVariables(fSolutionVarindex);
    int64_t nel = cmesh->Reference()->NElements();
    int64_t el;
    for (el=0; el<nel; el++) {
        TPZGeoEl *gel = fMesh->Reference()->Element(el);
        if (gel && gel->Dimension() == fDimension) {
            break;
        }
    }
    if (el==nel) {
        DebugStop();
    }
    fGeoElIndex = el;
}